

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inlining.cpp
# Opt level: O0

Function * __thiscall
wasm::anon_unknown_18::FunctionSplitter::doSplit
          (FunctionSplitter *this,Function *func,InliningMode inliningMode)

{
  Name target;
  Name target_00;
  bool bVar1;
  Function *pFVar2;
  Unary *pUVar3;
  Call *pCVar4;
  Block *pBVar5;
  ExpressionList *this_00;
  Type type;
  Return *pRVar6;
  bool local_231;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_1a0;
  size_t local_188;
  char *pcStack_180;
  Type local_178;
  BasicType local_170 [2];
  Type local_168;
  bool local_15a;
  allocator<char> local_159;
  undefined1 local_158 [6];
  bool valueReturned;
  Function *local_138;
  Function *outlined_1;
  If *inlineableIf_1;
  Index local_120;
  Index i;
  Index MaxIfs;
  Function *local_f8;
  Function *inlineable;
  ExpressionList *local_e0;
  ExpressionList *outlinedList;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_d0;
  size_t local_b8;
  char *pcStack_b0;
  If *local_a8;
  If *inlineableIf;
  string local_98;
  Function *local_78;
  Function *outlined;
  allocator<char> local_59;
  string local_58;
  Function *local_38;
  Function *inlineable_1;
  Builder builder;
  InliningMode inliningMode_local;
  Function *func_local;
  FunctionSplitter *this_local;
  
  builder.wasm._4_4_ = inliningMode;
  Builder::Builder((Builder *)&inlineable_1,this->module);
  if (builder.wasm._4_4_ == SplitPatternA) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"inlineable-A",&local_59)
    ;
    pFVar2 = copyFunction(this,func,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::allocator<char>::~allocator(&local_59);
    local_38 = pFVar2;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,"outlined-A",(allocator<char> *)((long)&inlineableIf + 7));
    pFVar2 = copyFunction(this,func,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator((allocator<char> *)((long)&inlineableIf + 7));
    local_78 = pFVar2;
    local_a8 = getIf(local_38->body,0);
    pUVar3 = Builder::makeUnary((Builder *)&inlineable_1,EqZInt32,local_a8->condition);
    local_a8->condition = (Expression *)pUVar3;
    local_b8 = (local_78->super_Importable).super_Named.name.super_IString.str._M_len;
    pcStack_b0 = (local_78->super_Importable).super_Named.name.super_IString.str._M_str;
    getForwardedArgs(&local_d0,this,func,(Builder *)&inlineable_1);
    wasm::Type::Type((Type *)&outlinedList,none);
    target_00.super_IString.str._M_str = pcStack_b0;
    target_00.super_IString.str._M_len = local_b8;
    pCVar4 = Builder::makeCall((Builder *)&inlineable_1,target_00,&local_d0,(Type)outlinedList,false
                              );
    local_a8->ifTrue = (Expression *)pCVar4;
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector(&local_d0);
    local_38->body = (Expression *)local_a8;
    pBVar5 = Expression::cast<wasm::Block>(local_78->body);
    this_00 = &pBVar5->list;
    local_e0 = this_00;
    _inlineable = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::begin
                            (&this_00->
                              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            );
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::erase
              (&this_00->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
               _inlineable);
    this_local = (FunctionSplitter *)local_38;
  }
  else {
    if (builder.wasm._4_4_ != SplitPatternB) {
      __assert_fail("inliningMode == InliningMode::SplitPatternB",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Inlining.cpp"
                    ,0x421,
                    "Function *wasm::(anonymous namespace)::FunctionSplitter::doSplit(Function *, InliningMode)"
                   );
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&MaxIfs,"inlineable-B",(allocator<char> *)((long)&i + 3));
    pFVar2 = copyFunction(this,func,(string *)&MaxIfs);
    std::__cxx11::string::~string((string *)&MaxIfs);
    std::allocator<char>::~allocator((allocator<char> *)((long)&i + 3));
    local_120 = (this->options->inlining).partialInliningIfs;
    local_f8 = pFVar2;
    if (local_120 == 0) {
      __assert_fail("MaxIfs > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Inlining.cpp"
                    ,0x426,
                    "Function *wasm::(anonymous namespace)::FunctionSplitter::doSplit(Function *, InliningMode)"
                   );
    }
    inlineableIf_1._4_4_ = 0;
    while ((inlineableIf_1._4_4_ < local_120 &&
           (outlined_1 = (Function *)getIf(local_f8->body,inlineableIf_1._4_4_),
           outlined_1 != (Function *)0x0))) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_158,"outlined-B",&local_159);
      pFVar2 = copyFunction(this,func,(string *)local_158);
      std::__cxx11::string::~string((string *)local_158);
      std::allocator<char>::~allocator(&local_159);
      pFVar2->body = (Expression *)(outlined_1->super_Importable).module.super_IString.str._M_len;
      local_138 = pFVar2;
      local_168 = Function::getResults(func);
      local_170[1] = 0;
      bVar1 = wasm::Type::operator!=(&local_168,local_170 + 1);
      local_231 = false;
      if (bVar1) {
        local_170[0] = none;
        local_231 = wasm::Type::operator!=(&local_138->body->type,local_170);
      }
      pFVar2 = local_138;
      local_15a = local_231;
      if (local_231 == false) {
        wasm::Type::Type(&local_178,none);
      }
      else {
        local_178 = Function::getResults(func);
      }
      Function::setResults(pFVar2,local_178);
      local_188 = (local_138->super_Importable).super_Named.name.super_IString.str._M_len;
      pcStack_180 = (local_138->super_Importable).super_Named.name.super_IString.str._M_str;
      getForwardedArgs(&local_1a0,this,func,(Builder *)&inlineable_1);
      type = Function::getResults(local_138);
      target.super_IString.str._M_str = pcStack_180;
      target.super_IString.str._M_len = local_188;
      pCVar4 = Builder::makeCall((Builder *)&inlineable_1,target,&local_1a0,type,false);
      (outlined_1->super_Importable).module.super_IString.str._M_len = (size_t)pCVar4;
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector(&local_1a0);
      if ((local_15a & 1U) != 0) {
        pRVar6 = Builder::makeReturn((Builder *)&inlineable_1,
                                     (Expression *)
                                     (outlined_1->super_Importable).module.super_IString.str._M_len)
        ;
        (outlined_1->super_Importable).module.super_IString.str._M_len = (size_t)pRVar6;
      }
      inlineableIf_1._4_4_ = inlineableIf_1._4_4_ + 1;
    }
    this_local = (FunctionSplitter *)local_f8;
  }
  return (Function *)this_local;
}

Assistant:

Function* doSplit(Function* func, InliningMode inliningMode) {
    Builder builder(*module);

    if (inliningMode == InliningMode::SplitPatternA) {
      // Note that "A" in the name here identifies this as being a split from
      // pattern A. The second pattern B will have B in the name.
      Function* inlineable = copyFunction(func, "inlineable-A");
      auto* outlined = copyFunction(func, "outlined-A");

      // The inlineable function should only have the if, which will call the
      // outlined function with a flipped condition.
      auto* inlineableIf = getIf(inlineable->body);
      inlineableIf->condition =
        builder.makeUnary(EqZInt32, inlineableIf->condition);
      inlineableIf->ifTrue = builder.makeCall(
        outlined->name, getForwardedArgs(func, builder), Type::none);
      inlineable->body = inlineableIf;

      // The outlined function no longer needs the initial if.
      auto& outlinedList = outlined->body->cast<Block>()->list;
      outlinedList.erase(outlinedList.begin());

      return inlineable;
    }

    assert(inliningMode == InliningMode::SplitPatternB);

    Function* inlineable = copyFunction(func, "inlineable-B");

    const Index MaxIfs = options.inlining.partialInliningIfs;
    assert(MaxIfs > 0);

    // The inlineable function should only have the ifs, which will call the
    // outlined heavy work.
    for (Index i = 0; i < MaxIfs; i++) {
      // For each if, create an outlined function with the body of that if,
      // and call that from the if.
      auto* inlineableIf = getIf(inlineable->body, i);
      if (!inlineableIf) {
        break;
      }
      auto* outlined = copyFunction(func, "outlined-B");
      outlined->body = inlineableIf->ifTrue;

      // The outlined function either returns the same results as the original
      // one, or nothing, depending on if a value is returned here.
      auto valueReturned =
        func->getResults() != Type::none && outlined->body->type != Type::none;
      outlined->setResults(valueReturned ? func->getResults() : Type::none);
      inlineableIf->ifTrue = builder.makeCall(outlined->name,
                                              getForwardedArgs(func, builder),
                                              outlined->getResults());
      if (valueReturned) {
        inlineableIf->ifTrue = builder.makeReturn(inlineableIf->ifTrue);
      }
    }

    return inlineable;
  }